

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

Option * __thiscall CLI::App::operator[](App *this,string *option_name)

{
  Option *pOVar1;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,(string *)option_name);
  pOVar1 = get_option(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return pOVar1;
}

Assistant:

const Option *operator[](const std::string &option_name) const { return get_option(option_name); }